

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChargeAtomTypesSectionParser.cpp
# Opt level: O0

void __thiscall
OpenMD::ChargeAtomTypesSectionParser::parseLine
          (ChargeAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  RealType RVar1;
  uint in_ECX;
  ForceField *in_RDX;
  string *in_RDI;
  RealType RVar2;
  RealType charge;
  FixedChargeAdapter fca;
  AtomType *atomType;
  string atomTypeName;
  RealType cus_;
  int nTokens;
  StringTokenizer tokenizer;
  errorStruct *in_stack_fffffffffffffec0;
  StringTokenizer *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  allocator<char> *charge_00;
  FixedChargeAdapter local_e8;
  AtomType *local_e0;
  string local_d8 [32];
  RealType local_b8;
  int local_b0;
  allocator<char> local_99;
  StringTokenizer *in_stack_ffffffffffffff68;
  
  charge_00 = &local_99;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDX,
             (char *)in_RDI,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  StringTokenizer::StringTokenizer
            ((StringTokenizer *)in_RDX,in_RDI,
             (string *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  std::allocator<char>::~allocator(&local_99);
  local_b0 = StringTokenizer::countTokens(in_stack_fffffffffffffed0);
  if (local_b0 < 2) {
    snprintf(painCave.errMsg,2000,
             "ChargeAtomTypesSectionParser Error: Not enough tokens at line %d\n",(ulong)in_ECX);
    painCave.isFatal = 1;
    simError();
  }
  else {
    local_b8 = ForceFieldOptions::getChargeUnitScaling((ForceFieldOptions *)0x326dd0);
    StringTokenizer::nextToken_abi_cxx11_(in_stack_ffffffffffffff68);
    local_e0 = ForceField::getAtomType(in_RDX,in_RDI);
    if (local_e0 == (AtomType *)0x0) {
      in_stack_fffffffffffffec0 = &painCave;
      snprintf(painCave.errMsg,2000,
               "ChargeAtomTypesSectionParser Error: Can not find matching AtomType at line %d\n",
               (ulong)in_ECX);
      in_stack_fffffffffffffec0->isFatal = 1;
      simError();
    }
    else {
      FixedChargeAdapter::FixedChargeAdapter(&local_e8,local_e0);
      RVar1 = local_b8;
      RVar2 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_RDX);
      FixedChargeAdapter::makeFixedCharge((FixedChargeAdapter *)(RVar1 * RVar2),(RealType)charge_00)
      ;
    }
    std::__cxx11::string::~string(local_d8);
  }
  StringTokenizer::~StringTokenizer((StringTokenizer *)in_stack_fffffffffffffec0);
  return;
}

Assistant:

void ChargeAtomTypesSectionParser::parseLine(ForceField& ff,
                                               const std::string& line,
                                               int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();

    if (nTokens < 2) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "ChargeAtomTypesSectionParser Error: Not enough tokens at line %d\n",
          lineNo);
      painCave.isFatal = 1;
      simError();
    } else {
      RealType cus_ = options_.getChargeUnitScaling();

      std::string atomTypeName = tokenizer.nextToken();

      AtomType* atomType = ff.getAtomType(atomTypeName);
      if (atomType != NULL) {
        FixedChargeAdapter fca = FixedChargeAdapter(atomType);
        RealType charge        = cus_ * tokenizer.nextTokenAsDouble();
        fca.makeFixedCharge(charge);
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "ChargeAtomTypesSectionParser Error: Can not find matching "
                 "AtomType at "
                 "line %d\n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      }
    }
  }